

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

void __thiscall CVmObjFrameRef::CVmObjFrameRef(CVmObjFrameRef *this,vm_val_t *fp,uchar *entry)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  vm_frameref_ext *pvVar5;
  vm_val_t *pvVar6;
  uchar *in_RDX;
  vm_val_t *in_RSI;
  CVmObject *in_RDI;
  int i;
  vm_frameref_ext *ext;
  int nparams;
  int nlocals;
  CVmFuncPtr f;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int iVar7;
  CVmObjFrameRef *in_stack_ffffffffffffffd0;
  CVmFuncPtr local_20;
  uchar *local_18;
  vm_val_t *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  CVmObject::CVmObject(in_RDI);
  in_RDI->_vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_00444ca8;
  CVmFuncPtr::CVmFuncPtr(&local_20,local_18);
  uVar2 = CVmFuncPtr::get_local_cnt((CVmFuncPtr *)0x352fae);
  iVar3 = CVmRun::get_argc_from_frame((vm_val_t *)0x352fbc);
  in_RDI->ext_ = (char *)0x0;
  pvVar5 = alloc_ext(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  pvVar5->fp = local_10;
  pvVar5->entryp = local_18;
  CVmFuncPtr::get_fnptr
            ((CVmFuncPtr *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (vm_val_t *)in_RDI);
  for (iVar7 = 0; iVar7 < (int)(uVar2 + iVar3); iVar7 = iVar7 + 1) {
    vm_val_t::set_nil(pvVar5->vars + iVar7);
  }
  pvVar6 = CVmRun::get_self_val_from_frame((vm_val_t *)0x353056);
  uVar1 = *(undefined4 *)&pvVar6->field_0x4;
  (pvVar5->self).typ = pvVar6->typ;
  *(undefined4 *)&(pvVar5->self).field_0x4 = uVar1;
  (pvVar5->self).val = pvVar6->val;
  vVar4 = CVmRun::get_defining_obj_from_frame((vm_val_t *)in_RDI);
  pvVar5->defobj = vVar4;
  vVar4 = CVmRun::get_orig_target_obj_from_frame((vm_val_t *)in_RDI);
  pvVar5->targobj = vVar4;
  vVar4 = CVmRun::get_defining_obj_from_frame((vm_val_t *)in_RDI);
  pvVar5->defobj = vVar4;
  return;
}

Assistant:

CVmObjFrameRef::CVmObjFrameRef(VMG_ vm_val_t *fp,
                               const uchar *entry)
{
    /* set up a function pointer */
    CVmFuncPtr f(entry);

    /* 
     *   figure the total number of variable snapshot slots we need to
     *   allocate: this is the number of local variables plus the number of
     *   actual arguments 
     */
    int nlocals = f.get_local_cnt();
    int nparams = G_interpreter->get_argc_from_frame(vmg_ fp);

    /* allocate our extension */
    ext_ = 0;
    vm_frameref_ext *ext = alloc_ext(vmg_ nlocals, nparams);

    /* save the extra frame information */
    ext->fp = fp;
    ext->entryp = entry;

    /* get the function pointer value for the entry pointer */
    f.get_fnptr(vmg_ &ext->entry);

    /* initialize the variable slots to nil */
    for (int i = 0 ; i < nlocals + nparams ; ++i)
        ext->vars[i].set_nil();

    /* 
     *   save the method context variables - these are immutable, so we can
     *   save them immediately 
     */
    ext->self = *G_interpreter->get_self_val_from_frame(vmg_ fp);
    ext->defobj = G_interpreter->get_defining_obj_from_frame(vmg_ fp);
    ext->targobj = G_interpreter->get_orig_target_obj_from_frame(vmg_ fp);
    ext->defobj = G_interpreter->get_defining_obj_from_frame(vmg_ fp);
}